

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.cc
# Opt level: O0

void __thiscall WaveformGenerator::set_chip_model(WaveformGenerator *this,chip_model model)

{
  chip_model model_local;
  WaveformGenerator *this_local;
  
  if (model == MOS6581) {
    this->wave__ST = wave6581__ST;
    this->wave_P_T = wave6581_P_T;
    this->wave_PS_ = wave6581_PS_;
    this->wave_PST = wave6581_PST;
  }
  else {
    this->wave__ST = wave8580__ST;
    this->wave_P_T = wave8580_P_T;
    this->wave_PS_ = wave8580_PS_;
    this->wave_PST = wave8580_PST;
  }
  return;
}

Assistant:

void WaveformGenerator::set_chip_model(chip_model model)
{
  if (model == MOS6581) {
    wave__ST = wave6581__ST;
    wave_P_T = wave6581_P_T;
    wave_PS_ = wave6581_PS_;
    wave_PST = wave6581_PST;
  }
  else {
    wave__ST = wave8580__ST;
    wave_P_T = wave8580_P_T;
    wave_PS_ = wave8580_PS_;
    wave_PST = wave8580_PST;
  }
}